

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.h
# Opt level: O0

void __thiscall serial::SerialException::SerialException(SerialException *this,char *description)

{
  ostream *poVar1;
  string local_1d0 [48];
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  char *local_18;
  char *description_local;
  SerialException *this_local;
  
  local_18 = description;
  description_local = (char *)this;
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__SerialException_00180900;
  std::__cxx11::string::string((string *)&this->e_what_);
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"SerialException ");
  poVar1 = std::operator<<(poVar1,local_18);
  std::operator<<(poVar1," failed.");
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)&this->e_what_,local_1d0);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

SerialException (const char *description) {
      std::stringstream ss;
      ss << "SerialException " << description << " failed.";
      e_what_ = ss.str();
  }